

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O2

uint8_t * __thiscall
proto2_unittest::Aggregate::_InternalSerialize
          (Aggregate *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  Aggregate *value;
  FileOptions *value_00;
  AggregateMessageSet *value_01;
  Any *value_02;
  ulong uVar1;
  anon_union_56_1_493b367e_for_Aggregate_5 aVar2;
  uint8_t *puVar3;
  char *in_R9;
  undefined8 *puVar4;
  string_view s;
  string_view field_name;
  
  aVar2 = this->field_0;
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x20) != (undefined1  [56])0x0) {
    target = google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>
                       (stream,(this->field_0)._impl_.i_,target);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x1) != (undefined1  [56])0x0) {
    puVar4 = (undefined8 *)((ulong)(this->field_0)._impl_.s_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    field_name._M_str = in_R9;
    field_name._M_len = (size_t)"proto2_unittest.Aggregate.s";
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((WireFormatLite *)*puVar4,(char *)(ulong)*(uint *)(puVar4 + 1),1,0x1b,field_name);
    s._M_str = (char *)*puVar4;
    s._M_len = puVar4[1];
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased(stream,2,s,target);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x2) != (undefined1  [56])0x0) {
    value = (this->field_0)._impl_.sub_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (3,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x4) != (undefined1  [56])0x0) {
    value_00 = (this->field_0)._impl_.file_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (4,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x8) != (undefined1  [56])0x0) {
    value_01 = (this->field_0)._impl_.mset_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (5,(MessageLite *)value_01,(value_01->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  if (((undefined1  [56])aVar2 & (undefined1  [56])0x10) != (undefined1  [56])0x0) {
    value_02 = (this->field_0)._impl_.any_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (6,(MessageLite *)value_02,*(int *)((long)&value_02->field_0 + 4),target,
                        stream);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar3 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL Aggregate::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const Aggregate& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.Aggregate)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional int32 i = 1;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target =
        ::google::protobuf::internal::WireFormatLite::WriteInt32ToArrayWithField<1>(
            stream, this_._internal_i(), target);
  }

  // optional string s = 2;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_s();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "proto2_unittest.Aggregate.s");
    target = stream->WriteStringMaybeAliased(2, _s, target);
  }

  // optional .proto2_unittest.Aggregate sub = 3;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        3, *this_._impl_.sub_, this_._impl_.sub_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.FileOptions file = 4;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        4, *this_._impl_.file_, this_._impl_.file_->GetCachedSize(), target,
        stream);
  }

  // optional .proto2_unittest.AggregateMessageSet mset = 5;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        5, *this_._impl_.mset_, this_._impl_.mset_->GetCachedSize(), target,
        stream);
  }

  // optional .google.protobuf.Any any = 6;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        6, *this_._impl_.any_, this_._impl_.any_->GetCachedSize(), target,
        stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.Aggregate)
  return target;
}